

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

void __thiscall
icu_63::ModulusSubstitution::doSubstitution
          (ModulusSubstitution *this,int64_t number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->ruleToUse != (NFRule *)0x0) {
    iVar1 = (*(this->super_NFSubstitution).super_UObject._vptr_UObject[8])(this);
    NFRule::doFormat(this->ruleToUse,CONCAT44(extraout_var,iVar1),toInsertInto,
                     _pos + (this->super_NFSubstitution).pos,recursionCount,status);
    return;
  }
  NFSubstitution::doSubstitution
            (&this->super_NFSubstitution,number,toInsertInto,_pos,recursionCount,status);
  return;
}

Assistant:

void
ModulusSubstitution::doSubstitution(int64_t number, UnicodeString& toInsertInto, int32_t _pos, int32_t recursionCount, UErrorCode& status) const
{
    // if this isn't a >>> substitution, just use the inherited version
    // of this function (which uses either a rule set or a DecimalFormat
    // to format its substitution value)
    if (ruleToUse == NULL) {
        NFSubstitution::doSubstitution(number, toInsertInto, _pos, recursionCount, status);

        // a >>> substitution goes straight to a particular rule to
        // format the substitution value
    } else {
        int64_t numberToFormat = transformNumber(number);
        ruleToUse->doFormat(numberToFormat, toInsertInto, _pos + getPos(), recursionCount, status);
    }
}